

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void glcts::anon_unknown_0::ShaderSourceFactory::streamUniformValidator
               (ostringstream *ret,Uniform *uniform,GLenum shader,char *outTemporary)

{
  UniformValue *this;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pair<int,_int> pVar5;
  int arrayElem;
  char *pcVar6;
  pointer pUVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  string columnIndex;
  string absoluteF;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  long *local_1c8 [2];
  long local_1b8 [2];
  char *local_1a8;
  long local_1a0;
  char local_198;
  undefined7 uStack_197;
  ios_base local_138 [264];
  
  bVar1 = DefOccurence::occurs((DefOccurence *)(ulong)(uniform->declOccurence).occurence,shader);
  if ((bVar1) &&
     (bVar1 = DefOccurence::occurs
                        ((DefOccurence *)(ulong)(uniform->usageOccurence).occurence,shader), bVar1))
  {
    if ((uniform->type).baseType == 0) {
      pUVar7 = (uniform->childUniforms).
               super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((uniform->childUniforms).
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          ._M_impl.super__Vector_impl_data._M_finish != pUVar7) {
        lVar10 = 0;
        uVar9 = 0;
        do {
          streamUniformValidator
                    (ret,(Uniform *)((long)&(pUVar7->type).enumType + lVar10),shader,outTemporary);
          uVar9 = uVar9 + 1;
          pUVar7 = (uniform->childUniforms).
                   super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x1d8;
        } while (uVar9 < (ulong)(((long)(uniform->childUniforms).
                                        super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7 >>
                                 3) * -0x34115b1e5f75270d));
      }
    }
    else {
      iVar8 = (uniform->type).arraySize;
      if (0 < iVar8) {
        this = &uniform->value;
        pVar5 = (uniform->type).size;
        arrayElem = 0;
        do {
          if (0 < pVar5.second) {
            iVar8 = 0;
            do {
              local_1e8 = &local_1d8;
              local_1e0 = 0;
              local_1d8 = '\0';
              if (1 < pVar5.second) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[",1);
                poVar3 = (ostream *)std::ostream::operator<<(&local_1a8,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1c8);
                if (local_1c8[0] != local_1b8) {
                  operator_delete(local_1c8[0],local_1b8[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                std::ios_base::~ios_base(local_138);
              }
              local_1a8 = &local_198;
              local_1a0 = 0;
              local_198 = '\0';
              if ((uniform->type).signedType == true) {
                std::__cxx11::string::_M_replace((ulong)&local_1a8,0,(char *)0x0,0x1a4c7ae);
              }
              if ((uniform->type).baseType == 0x82e6) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                           "\n    if (any(greaterThan(",0x19);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                    local_1a8,local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(texture(",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar3,(uniform->name)._M_dataplus._M_p,(uniform->name)._M_string_length)
                ;
                UniformType::streamArrayStr(&uniform->type,ret,arrayElem);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                    local_1e8,local_1e0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,", vec2(0.5)) - ",0xf);
                UniformValue::streamValue(this,ret,arrayElem,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&ret->super_basic_ostream<char,_std::char_traits<char>_>," ), ",4);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                    (uniform->type).refStrType._M_dataplus._M_p,
                                    (uniform->type).refStrType._M_string_length);
                iVar2 = 0x1b54568;
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
                iVar2 = UniformType::abs((UniformType *)(ulong)(uniform->type).baseType,iVar2);
                sVar4 = strlen((char *)CONCAT44(extraout_var,iVar2));
                lVar10 = 6;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar3,(char *)CONCAT44(extraout_var,iVar2),sVar4);
                pcVar6 = ")))) {";
              }
              else if ((uniform->type).size.first < 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n    if (",9);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                    local_1a8,local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar3,(uniform->name)._M_dataplus._M_p,(uniform->name)._M_string_length)
                ;
                UniformType::streamArrayStr(&uniform->type,ret,arrayElem);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&ret->super_basic_ostream<char,_std::char_traits<char>_>," - ",3);
                UniformValue::streamValue(this,ret,arrayElem,0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&ret->super_basic_ostream<char,_std::char_traits<char>_>,") >",3);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                    (uniform->type).refStrType._M_dataplus._M_p,
                                    (uniform->type).refStrType._M_string_length);
                iVar2 = 0x1b54568;
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
                iVar2 = UniformType::abs((UniformType *)(ulong)(uniform->type).baseType,iVar2);
                sVar4 = strlen((char *)CONCAT44(extraout_var_01,iVar2));
                lVar10 = 4;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar3,(char *)CONCAT44(extraout_var_01,iVar2),sVar4);
                pcVar6 = ")) {";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                           "\n    if (any(greaterThan(",0x19);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                    local_1a8,local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar3,(uniform->name)._M_dataplus._M_p,(uniform->name)._M_string_length)
                ;
                UniformType::streamArrayStr(&uniform->type,ret,arrayElem);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                    local_1e8,local_1e0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
                UniformValue::streamValue(this,ret,arrayElem,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"), ",3);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                    (uniform->type).refStrType._M_dataplus._M_p,
                                    (uniform->type).refStrType._M_string_length);
                iVar2 = 0x1b54568;
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
                iVar2 = UniformType::abs((UniformType *)(ulong)(uniform->type).baseType,iVar2);
                sVar4 = strlen((char *)CONCAT44(extraout_var_00,iVar2));
                lVar10 = 6;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar3,(char *)CONCAT44(extraout_var_00,iVar2),sVar4);
                pcVar6 = ")))) {";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n       ",8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"validationResult"
                         ,0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                         " = vec4 (1.0, 0.0, 0.0, 1.0);",0x1d);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n    }",6);
              if (local_1a8 != &local_198) {
                operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
              }
              if (local_1e8 != &local_1d8) {
                operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
              }
              iVar8 = iVar8 + 1;
              pVar5 = (uniform->type).size;
            } while (iVar8 < pVar5.second);
            iVar8 = (uniform->type).arraySize;
          }
          arrayElem = arrayElem + 1;
        } while (arrayElem < iVar8);
      }
    }
  }
  return;
}

Assistant:

static void streamUniformValidator(std::ostringstream& ret, const Uniform& uniform, GLenum shader,
									   const char* outTemporary)
	{
		if (uniform.declOccurence.occurs(shader) && uniform.usageOccurence.occurs(shader))
		{
			if (uniform.type.isStruct())
			{
				for (size_t child = 0; child < uniform.childUniforms.size(); child++)
				{
					streamUniformValidator(ret, uniform.childUniforms[child], shader, outTemporary);
				}
			}
			else
			{
				for (int arrayElement = 0; arrayElement < uniform.type.arraySize; arrayElement++)
				{
					for (int column = 0; column < uniform.type.getSize().second; column++)
					{
						std::string columnIndex;
						if (uniform.type.getSize().second > 1)
						{
							std::ostringstream str;
							str << "[" << column << "]";
							columnIndex = str.str();
						}
						std::string absoluteF;
						if (uniform.type.isSigned())
						{
							absoluteF = "abs";
						}

						if (uniform.type.getBaseType() == GL_SAMPLER)
						{
							ret << NL "    if (any(greaterThan(" << absoluteF << "(texture(" << uniform.getName();
							uniform.type.streamArrayStr(ret, arrayElement);
							ret << columnIndex << ", vec2(0.5)) - ";
							uniform.value.streamValue(ret, arrayElement, column);
							ret << " ), " << uniform.type.refStr() << "(" << uniform.type.abs() << ")))) {";
						}
						else if (uniform.type.getSize().first > 1)
						{
							ret << NL "    if (any(greaterThan(" << absoluteF << "(" << uniform.getName();
							uniform.type.streamArrayStr(ret, arrayElement);
							ret << columnIndex << " - ";
							uniform.value.streamValue(ret, arrayElement, column);
							ret << "), " << uniform.type.refStr() << "(" << uniform.type.abs() << ")))) {";
						}
						else
						{
							ret << NL "    if (" << absoluteF << "(" << uniform.getName();
							uniform.type.streamArrayStr(ret, arrayElement);
							ret << " - ";
							uniform.value.streamValue(ret, arrayElement);
							ret << ") >" << uniform.type.refStr() << "(" << uniform.type.abs() << ")) {";
						}
						ret << NL "       " << outTemporary << " = vec4 (1.0, 0.0, 0.0, 1.0);";
						ret << NL "    }";
					}
				}
			}
		}
	}